

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall Character::Refresh(Character *this)

{
  Character *this_00;
  NPC *pNVar1;
  pointer psVar2;
  pointer ppCVar3;
  bool bVar4;
  _List_node_base *p_Var5;
  pointer ppCVar6;
  list<Character_*,_std::allocator<Character_*>_> *plVar7;
  pointer ppNVar8;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *plVar9;
  pointer ppNVar10;
  __shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> updateitems;
  vector<NPC_*,_std::allocator<NPC_*>_> updatenpcs;
  vector<Character_*,_std::allocator<Character_*>_> updatecharacters;
  PacketBuilder builder;
  shared_ptr<Map_Item> item_1;
  
  updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  updateitems.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  updateitems.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  updateitems.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar7 = &this->map->characters;
  p_Var5 = (_List_node_base *)plVar7;
  while (p_Var5 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var5->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)plVar7) {
    builder._0_8_ = p_Var5[1]._M_next;
    bVar4 = InRange(this,(Character *)builder._0_8_);
    if (bVar4) {
      std::vector<Character_*,_std::allocator<Character_*>_>::push_back
                (&updatecharacters,(value_type *)&builder);
    }
  }
  ppNVar10 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (ppNVar8 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar8 != ppNVar10; ppNVar8 = ppNVar8 + 1) {
    builder._0_8_ = *ppNVar8;
    bVar4 = InRange(this,(NPC *)builder._0_8_);
    if ((bVar4) && (*(char *)(builder._0_8_ + 0x10) == '\x01')) {
      std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back(&updatenpcs,(value_type *)&builder);
    }
  }
  plVar9 = &this->map->items;
  p_Var5 = (_List_node_base *)plVar9;
  while (p_Var5 = (((_List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                     *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)plVar9) {
    std::__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)&builder,
               (__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)(p_Var5 + 1));
    bVar4 = InRange(this,(Map_Item *)builder._0_8_);
    if (bVar4) {
      std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::push_back
                (&updateitems,(value_type *)&builder);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&builder.data);
  }
  PacketBuilder::PacketBuilder
            (&builder,PACKET_REFRESH,PACKET_REPLY,
             ((long)updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 6 +
             ((long)updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x3c +
             ((long)updateitems.
                    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)updateitems.
                    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 9 + 3);
  PacketBuilder::AddChar
            (&builder,(int)((ulong)((long)updatecharacters.
                                          super__Vector_base<Character_*,_std::allocator<Character_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)updatecharacters.
                                         super__Vector_base<Character_*,_std::allocator<Character_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  PacketBuilder::AddByte(&builder,0xff);
  ppCVar3 = updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar6 = updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppNVar8 = updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                super__Vector_impl_data._M_finish, ppCVar6 != ppCVar3; ppCVar6 = ppCVar6 + 1) {
    this_00 = *ppCVar6;
    (*(this_00->super_Command_Source)._vptr_Command_Source[2])((string *)&item_1,this_00);
    PacketBuilder::AddBreakString(&builder,(string *)&item_1,0xff);
    std::__cxx11::string::~string((string *)&item_1);
    PacketBuilder::AddShort(&builder,this_00->player->id);
    PacketBuilder::AddShort(&builder,(int)this_00->mapid);
    PacketBuilder::AddShort(&builder,(uint)this_00->x);
    PacketBuilder::AddShort(&builder,(uint)this_00->y);
    PacketBuilder::AddChar(&builder,(uint)this_00->direction);
    PacketBuilder::AddChar(&builder,6);
    PaddedGuildTag_abi_cxx11_((string *)&item_1,this_00);
    PacketBuilder::AddString(&builder,(string *)&item_1);
    std::__cxx11::string::~string((string *)&item_1);
    PacketBuilder::AddChar(&builder,(uint)this_00->level);
    PacketBuilder::AddChar(&builder,(uint)this_00->gender);
    PacketBuilder::AddChar(&builder,(uint)this_00->hairstyle);
    PacketBuilder::AddChar(&builder,(uint)this_00->haircolor);
    PacketBuilder::AddChar(&builder,(uint)this_00->race);
    PacketBuilder::AddShort(&builder,this_00->maxhp);
    PacketBuilder::AddShort(&builder,this_00->hp);
    PacketBuilder::AddShort(&builder,this_00->maxtp);
    PacketBuilder::AddShort(&builder,this_00->tp);
    AddPaperdollData(this_00,&builder,"B000A0HSW");
    PacketBuilder::AddChar(&builder,(uint)this_00->sitting);
    PacketBuilder::AddChar(&builder,this_00->hidden & 1);
    PacketBuilder::AddByte(&builder,0xff);
  }
  for (ppNVar10 = updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppNVar10 != ppNVar8; ppNVar10 = ppNVar10 + 1) {
    pNVar1 = *ppNVar10;
    PacketBuilder::AddChar(&builder,(uint)pNVar1->index);
    PacketBuilder::AddShort(&builder,pNVar1->id);
    PacketBuilder::AddChar(&builder,(uint)pNVar1->x);
    PacketBuilder::AddChar(&builder,(uint)pNVar1->y);
    PacketBuilder::AddChar(&builder,(uint)pNVar1->direction);
  }
  PacketBuilder::AddByte(&builder,0xff);
  psVar2 = updateitems.
           super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (p_Var11 = &(updateitems.
                   super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
      p_Var11 != &psVar2->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
      p_Var11 = p_Var11 + 1) {
    std::__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>,p_Var11);
    PacketBuilder::AddShort
              (&builder,(int)(item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->uid);
    PacketBuilder::AddShort
              (&builder,(int)(item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->id);
    PacketBuilder::AddChar
              (&builder,(uint)(item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->x);
    PacketBuilder::AddChar
              (&builder,(uint)(item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->y);
    PacketBuilder::AddThree
              (&builder,(item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        amount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  Send(this,&builder);
  PacketBuilder::~PacketBuilder(&builder);
  std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::~vector
            (&updateitems);
  std::_Vector_base<NPC_*,_std::allocator<NPC_*>_>::~_Vector_base
            (&updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>);
  std::_Vector_base<Character_*,_std::allocator<Character_*>_>::~_Vector_base
            (&updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>);
  return;
}

Assistant:

void Character::Refresh()
{
	std::vector<Character *> updatecharacters;
	std::vector<NPC *> updatenpcs;
	std::vector<std::shared_ptr<Map_Item>> updateitems;

	UTIL_FOREACH(this->map->characters, character)
	{
		if (this->InRange(character))
		{
			updatecharacters.push_back(character);
		}
	}

	UTIL_FOREACH(this->map->npcs, npc)
	{
		if (this->InRange(npc) && npc->alive)
		{
			updatenpcs.push_back(npc);
		}
	}

	UTIL_FOREACH(this->map->items, item)
	{
		if (this->InRange(*item))
		{
			updateitems.push_back(item);
		}
	}

	PacketBuilder builder(PACKET_REFRESH, PACKET_REPLY, 3 + updatecharacters.size() * 60 + updatenpcs.size() * 6 + updateitems.size() * 9);
	builder.AddChar(updatecharacters.size()); // Number of players
	builder.AddByte(255);

	UTIL_FOREACH(updatecharacters, character)
	{
		builder.AddBreakString(character->SourceName());
		builder.AddShort(character->PlayerID());
		builder.AddShort(character->mapid);
		builder.AddShort(character->x);
		builder.AddShort(character->y);
		builder.AddChar(character->direction);
		builder.AddChar(6); // ?
		builder.AddString(character->PaddedGuildTag());
		builder.AddChar(character->level);
		builder.AddChar(character->gender);
		builder.AddChar(character->hairstyle);
		builder.AddChar(character->haircolor);
		builder.AddChar(character->race);
		builder.AddShort(character->maxhp);
		builder.AddShort(character->hp);
		builder.AddShort(character->maxtp);
		builder.AddShort(character->tp);
		// equipment
		character->AddPaperdollData(builder, "B000A0HSW");

		builder.AddChar(character->sitting);
		builder.AddChar(character->IsHideInvisible());
		builder.AddByte(255);
	}

	UTIL_FOREACH(updatenpcs, npc)
	{
		builder.AddChar(npc->index);
		builder.AddShort(npc->id);
		builder.AddChar(npc->x);
		builder.AddChar(npc->y);
		builder.AddChar(npc->direction);
	}

	builder.AddByte(255);

	UTIL_FOREACH(updateitems, item)
	{
		builder.AddShort(item->uid);
		builder.AddShort(item->id);
		builder.AddChar(item->x);
		builder.AddChar(item->y);
		builder.AddThree(item->amount);
	}

	this->Send(builder);
}